

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

void vera::splitFacesFromVerticalCross<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  CubemapFace<float> *__s;
  ulong uVar6;
  float *pfVar7;
  int n;
  int offset;
  CubemapFace<float> *face;
  int iFace;
  int jFace;
  int l;
  int i;
  int faceHeight;
  int faceWidth;
  CubemapFace<float> **_faces_local;
  size_t _channels_local;
  size_t _height_local;
  size_t _width_local;
  float *_data_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _width;
  iVar3 = SUB164(auVar1 / ZEXT816(3),0);
  iVar4 = (int)(_height >> 2);
  for (jFace = 0; jFace < 6; jFace = jFace + 1) {
    __s = (CubemapFace<float> *)operator_new(0x18);
    memset(__s,0,0x18);
    _faces[jFace] = __s;
    _faces[jFace]->id = jFace;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(iVar3 * 3 * iVar4);
    uVar6 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pfVar7 = (float *)operator_new__(uVar6);
    _faces[jFace]->data = pfVar7;
    _faces[jFace]->width = iVar3;
    _faces[jFace]->height = iVar4;
    _faces[jFace]->currentOffset = 0;
  }
  for (iFace = 0; (ulong)(long)iFace < _height; iFace = iFace + 1) {
    iVar5 = (iFace - iFace % iVar4) / iVar4;
    for (face._0_4_ = 0; (int)face < 3; face._0_4_ = (int)face + 1) {
      _n = (CubemapFace<float> *)0x0;
      if (((int)face == 2) && (iVar5 == 1)) {
        _n = *_faces;
      }
      if (((int)face == 0) && (iVar5 == 1)) {
        _n = _faces[1];
      }
      if (((int)face == 1) && (iVar5 == 0)) {
        _n = _faces[2];
      }
      if (((int)face == 1) && (iVar5 == 2)) {
        _n = _faces[3];
      }
      if (((int)face == 1) && (iVar5 == 1)) {
        _n = _faces[4];
      }
      if (((int)face == 1) && (iVar5 == 3)) {
        _n = _faces[5];
      }
      if (_n != (CubemapFace<float> *)0x0) {
        memcpy(_n->data + _n->currentOffset,_data + (iVar3 * (int)face + iFace * (int)_width) * 3,
               (long)(iVar3 * 0xc));
        _n->currentOffset = iVar3 * 3 + _n->currentOffset;
      }
    }
  }
  return;
}

Assistant:

void splitFacesFromVerticalCross(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 3;
    int faceHeight = _height / 4;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;

        for (int iFace = 0; iFace < 3; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //      0   1   2   i
            //  3      -Z       
            //  2      -X 
            //  1  -Y  +Z  +Y       
            //  0      +X
            //  j
            //
            if (iFace == 2 && jFace == 1) face = _faces[0]; // POS_Y
            if (iFace == 0 && jFace == 1) face = _faces[1]; // NEG_Y
            if (iFace == 1 && jFace == 0) face = _faces[2]; // POS_X
            if (iFace == 1 && jFace == 2) face = _faces[3]; // NEG_X
            if (iFace == 1 && jFace == 1) face = _faces[4]; // POS_Z
            if (iFace == 1 && jFace == 3) face = _faces[5]; // NEG_Z

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}